

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeating_task.cc
# Opt level: O0

bool __thiscall dd::RepeatingTaskBase::Run(RepeatingTaskBase *this)

{
  TaskQueueBase *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  rep rVar4;
  uint64_t local_58;
  unique_ptr<dd::RepeatingTaskBase,_std::default_delete<dd::RepeatingTaskBase>_> local_38;
  unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_> local_30;
  long local_28;
  uint64_t lost_time;
  int64_t delay;
  RepeatingTaskBase *this_local;
  
  delay = (int64_t)this;
  bVar2 = IsPlusInfinity(this->_next_run_time);
  if (bVar2) {
    this_local._7_1_ = true;
  }
  else {
    iVar3 = (*(this->super_QueuedTask)._vptr_QueuedTask[3])();
    lost_time = CONCAT44(extraout_var,iVar3);
    bVar2 = IsPlusInfinity(this->_next_run_time);
    if (bVar2) {
      this_local._7_1_ = true;
    }
    else {
      rVar4 = GetCurrentTick();
      local_28 = rVar4 - this->_next_run_time;
      this->_next_run_time = lost_time + this->_next_run_time;
      local_58 = lost_time - local_28;
      if ((long)local_58 < 1) {
        local_58 = 0;
      }
      lost_time = local_58;
      pTVar1 = this->_task_queue;
      std::unique_ptr<dd::RepeatingTaskBase,std::default_delete<dd::RepeatingTaskBase>>::
      unique_ptr<std::default_delete<dd::RepeatingTaskBase>,void>
                ((unique_ptr<dd::RepeatingTaskBase,std::default_delete<dd::RepeatingTaskBase>> *)
                 &local_38,this);
      std::unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>>::
      unique_ptr<dd::RepeatingTaskBase,std::default_delete<dd::RepeatingTaskBase>,void>
                ((unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>> *)&local_30,
                 &local_38);
      (*pTVar1->_vptr_TaskQueueBase[2])
                (pTVar1,(unique_ptr<dd::QueuedTask,std::default_delete<dd::QueuedTask>> *)&local_30,
                 lost_time & 0xffffffff);
      std::unique_ptr<dd::QueuedTask,_std::default_delete<dd::QueuedTask>_>::~unique_ptr(&local_30);
      std::unique_ptr<dd::RepeatingTaskBase,_std::default_delete<dd::RepeatingTaskBase>_>::
      ~unique_ptr(&local_38);
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool RepeatingTaskBase::Run() {
		if (IsPlusInfinity(_next_run_time))
			return true;
		auto delay = RunClosure();
		if (IsPlusInfinity(_next_run_time))
			return true;

		uint64_t lost_time = GetCurrentTick() - _next_run_time;
		_next_run_time += delay;
		delay -= lost_time;
		delay = delay > 0 ? delay : 0;// (std::max)(delay, 0);
		_task_queue->PostDelayedTask(std::unique_ptr<RepeatingTaskBase>(this), delay);
		return false;
	}